

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

bool __thiscall
Fossilize::StateReplayer::Impl::parse_viewport_state
          (Impl *this,Value *vp,VkPipelineViewportStateCreateInfo **out_info)

{
  undefined8 uVar1;
  bool bVar2;
  VkPipelineViewportStateCreateInfo *pVVar3;
  Type pGVar4;
  Number NVar5;
  undefined8 local_30;
  
  pVVar3 = (VkPipelineViewportStateCreateInfo *)
           ScratchAllocator::allocate_raw(&this->allocator,0x30,0x10);
  if (pVVar3 != (VkPipelineViewportStateCreateInfo *)0x0) {
    *(undefined8 *)&pVVar3->scissorCount = 0;
    pVVar3->pScissors = (VkRect2D *)0x0;
    *(undefined8 *)&pVVar3->viewportCount = 0;
    *(undefined8 *)((long)&pVVar3->pViewports + 4) = 0;
    *(undefined8 *)&pVVar3->field_0x4 = 0;
    *(undefined8 *)((long)&pVVar3->pNext + 4) = 0;
  }
  pVVar3->sType = VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO;
  pGVar4 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)vp,"flags");
  if ((undefined1  [16])((undefined1  [16])pGVar4->data_ & (undefined1  [16])0x40000000000000) !=
      (undefined1  [16])0x0) {
    pVVar3->flags = (pGVar4->data_).s.length;
    pGVar4 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)vp,"scissorCount");
    if ((undefined1  [16])((undefined1  [16])pGVar4->data_ & (undefined1  [16])0x40000000000000) !=
        (undefined1  [16])0x0) {
      pVVar3->scissorCount = (pGVar4->data_).s.length;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)&stack0xffffffffffffffd0,(Ch *)vp);
      uVar1 = local_30;
      NVar5.i = (I)rapidjson::
                   GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   ::MemberEnd(vp);
      if (uVar1 != NVar5.i64) {
        pGVar4 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)vp,"scissors");
        parse_scissors(this,pGVar4,&pVVar3->pScissors);
      }
      pGVar4 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)vp,"viewportCount");
      if ((undefined1  [16])((undefined1  [16])pGVar4->data_ & (undefined1  [16])0x40000000000000)
          != (undefined1  [16])0x0) {
        pVVar3->viewportCount = (pGVar4->data_).s.length;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)&stack0xffffffffffffffd0,(Ch *)vp);
        uVar1 = local_30;
        NVar5.i = (I)rapidjson::
                     GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     ::MemberEnd(vp);
        if (uVar1 != NVar5.i64) {
          pGVar4 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                   ::operator[]<char_const>
                             ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                               *)vp,"viewports");
          parse_viewports(this,pGVar4,&pVVar3->pViewports);
        }
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)&stack0xffffffffffffffd0,(Ch *)vp);
        NVar5.i = (I)rapidjson::
                     GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     ::MemberEnd(vp);
        if (local_30 != NVar5.i64) {
          pGVar4 = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                   ::operator[]<char_const>
                             ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                               *)vp,"pNext");
          bVar2 = parse_pnext_chain(this,pGVar4,&pVVar3->pNext,(StateCreatorInterface *)0x0,
                                    (DatabaseInterface *)0x0,(Value *)0x0);
          if (!bVar2) {
            return false;
          }
        }
        *out_info = pVVar3;
        return true;
      }
    }
  }
  __assert_fail("data_.f.flags & kUintFlag",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                ,0x719,
                "unsigned int rapidjson::GenericValue<rapidjson::UTF8<>>::GetUint() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
               );
}

Assistant:

bool StateReplayer::Impl::parse_viewport_state(const Value &vp, const VkPipelineViewportStateCreateInfo **out_info)
{
	auto *state = allocator.allocate_cleared<VkPipelineViewportStateCreateInfo>();

	state->sType = VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO;
	state->flags = vp["flags"].GetUint();

	state->scissorCount = vp["scissorCount"].GetUint();
	if (vp.HasMember("scissors"))
		if (!parse_scissors(vp["scissors"], &state->pScissors))
			return false;

	state->viewportCount = vp["viewportCount"].GetUint();
	if (vp.HasMember("viewports"))
		if (!parse_viewports(vp["viewports"], &state->pViewports))
			return false;

	if (vp.HasMember("pNext"))
		if (!parse_pnext_chain(vp["pNext"], &state->pNext))
			return false;

	*out_info = state;
	return true;
}